

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O0

void __thiscall CGameWorld::RemoveEntity(CGameWorld *this,CEntity *pEnt)

{
  CEntity *pEnt_local;
  CGameWorld *this_local;
  
  if (((pEnt->m_pNextTypeEntity != (CEntity *)0x0) || (pEnt->m_pPrevTypeEntity != (CEntity *)0x0))
     || (this->m_apFirstEntityTypes[pEnt->m_ObjType] == pEnt)) {
    if (pEnt->m_pPrevTypeEntity == (CEntity *)0x0) {
      this->m_apFirstEntityTypes[pEnt->m_ObjType] = pEnt->m_pNextTypeEntity;
    }
    else {
      pEnt->m_pPrevTypeEntity->m_pNextTypeEntity = pEnt->m_pNextTypeEntity;
    }
    if (pEnt->m_pNextTypeEntity != (CEntity *)0x0) {
      pEnt->m_pNextTypeEntity->m_pPrevTypeEntity = pEnt->m_pPrevTypeEntity;
    }
    if (this->m_pNextTraverseEntity == pEnt) {
      this->m_pNextTraverseEntity = pEnt->m_pNextTypeEntity;
    }
    pEnt->m_pNextTypeEntity = (CEntity *)0x0;
    pEnt->m_pPrevTypeEntity = (CEntity *)0x0;
  }
  return;
}

Assistant:

void CGameWorld::RemoveEntity(CEntity *pEnt)
{
	// not in the list
	if(!pEnt->m_pNextTypeEntity && !pEnt->m_pPrevTypeEntity && m_apFirstEntityTypes[pEnt->m_ObjType] != pEnt)
		return;

	// remove
	if(pEnt->m_pPrevTypeEntity)
		pEnt->m_pPrevTypeEntity->m_pNextTypeEntity = pEnt->m_pNextTypeEntity;
	else
		m_apFirstEntityTypes[pEnt->m_ObjType] = pEnt->m_pNextTypeEntity;
	if(pEnt->m_pNextTypeEntity)
		pEnt->m_pNextTypeEntity->m_pPrevTypeEntity = pEnt->m_pPrevTypeEntity;

	// keep list traversing valid
	if(m_pNextTraverseEntity == pEnt)
		m_pNextTraverseEntity = pEnt->m_pNextTypeEntity;

	pEnt->m_pNextTypeEntity = 0;
	pEnt->m_pPrevTypeEntity = 0;
}